

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_CCtx_params params)

{
  ZSTD_cwksp *ws;
  size_t err_code;
  size_t sVar1;
  void *__dest;
  U32 *pUVar2;
  
  sVar1 = ZSTD_checkCParams(params.cParams);
  if (sVar1 != 0) {
    __assert_fail("!ZSTD_checkCParams(params.cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x14c9,
                  "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                 );
  }
  (cdict->matchState).cParams.searchLog = params.cParams.searchLog;
  (cdict->matchState).cParams.minMatch = params.cParams.minMatch;
  (cdict->matchState).cParams.targetLength = params.cParams.targetLength;
  (cdict->matchState).cParams.strategy = params.cParams.strategy;
  (cdict->matchState).cParams.windowLog = params.cParams.windowLog;
  (cdict->matchState).cParams.chainLog = params.cParams.chainLog;
  (cdict->matchState).cParams.hashLog = params.cParams.hashLog;
  (cdict->matchState).cParams.searchLog = params.cParams.searchLog;
  (cdict->matchState).dedicatedDictSearch = params.enableDedicatedDictSearch;
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictContent = dictBuffer;
  }
  else {
    __dest = ZSTD_cwksp_reserve_object(&cdict->workspace,dictSize + 7 & 0xfffffffffffffff8);
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    cdict->dictContent = __dest;
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  cdict->dictContentType = dictContentType;
  ws = &cdict->workspace;
  pUVar2 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x2200);
  cdict->entropyWorkspace = pUVar2;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  sVar1 = ZSTD_reset_matchState
                    (&cdict->matchState,ws,&params.cParams,params.useRowMatchFinder,
                     ZSTDcrp_makeClean,ZSTDirp_reset,ZSTD_resetTarget_CDict);
  if (sVar1 < 0xffffffffffffff89) {
    params.compressionLevel = 3;
    params.fParams.contentSizeFlag = 1;
    sVar1 = ZSTD_compress_insertDictionary
                      (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,ws,&params,
                       cdict->dictContent,cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,
                       ZSTD_tfp_forCDict,cdict->entropyWorkspace);
    if (sVar1 < 0xffffffffffffff89) {
      if (sVar1 >> 0x20 != 0) {
        __assert_fail("dictID <= (size_t)(U32)-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x14ee,
                      "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                     );
      }
      cdict->dictID = (U32)sVar1;
      sVar1 = 0;
    }
  }
  return sVar1;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_CCtx_params params)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(params.cParams));
    cdict->matchState.cParams = params.cParams;
    cdict->matchState.dedicatedDictSearch = params.enableDedicatedDictSearch;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation, "NULL pointer!");
        cdict->dictContent = internalBuffer;
        ZSTD_memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &params.cParams,
        params.useRowMatchFinder,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict), "");
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, ZSTD_tfp_forCDict, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}